

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

double __thiscall smf::Options::getDouble(Options *this,string *optionName)

{
  char *__nptr;
  double dVar1;
  undefined1 local_38 [40];
  string *optionName_local;
  Options *this_local;
  
  local_38._32_8_ = optionName;
  optionName_local = (string *)this;
  getString((Options *)local_38,(string *)this);
  __nptr = (char *)std::__cxx11::string::c_str();
  dVar1 = strtod(__nptr,(char **)0x0);
  std::__cxx11::string::~string((string *)local_38);
  return dVar1;
}

Assistant:

double Options::getDouble(const std::string& optionName) {
   return strtod(getString(optionName).c_str(), (char**)NULL);
}